

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateStFldWithCachedType
          (Lowerer *this,Instr *instrStFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  uint uVar1;
  InlineCacheIndex IVar2;
  SymOpnd *this_00;
  Sym *pSVar3;
  Func *func;
  code *pcVar4;
  LabelInstr **ppLVar5;
  Instr *this_01;
  LabelInstr *pLVar6;
  Lowerer *pLVar7;
  bool bVar8;
  OpndKind OVar9;
  BailOutKind BVar10;
  uint sourceContextId;
  uint functionId;
  PropertyId PVar11;
  undefined4 *puVar12;
  PropertySymOpnd *pPVar13;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar15;
  undefined7 extraout_var;
  JITType *this_03;
  JITTypeHandler *this_04;
  IntConstOpnd *opndArg;
  Instr *instr;
  LabelInstr *branchTarget;
  BranchInstr *pBVar16;
  JITTypeHolder finalType;
  BailOutInfo *pBVar17;
  byte bVar18;
  char16_t *pcVar19;
  char16_t *pcVar20;
  undefined4 uVar21;
  JITTypeHolderBase<void> local_80;
  LabelInstr **local_78;
  LabelInstr *local_70;
  JITTypeHolder local_68;
  Func *local_60;
  undefined4 local_54;
  Instr *local_50;
  RegOpnd **local_48;
  LabelInstr *local_40;
  Lowerer *local_38;
  
  local_38 = this;
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cdb,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cde,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce1,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  OVar9 = IR::Opnd::GetKind(instrStFld->m_dst);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce4,"(instrStFld->GetDst()->IsSymOpnd())",
                       "instrStFld->GetDst()->IsSymOpnd()");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
  this_00 = (SymOpnd *)instrStFld->m_dst;
  OVar9 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    local_50 = instrStFld;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
    instrStFld = local_50;
  }
  bVar8 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar8) {
    return false;
  }
  pPVar13 = IR::Opnd::AsPropertySymOpnd(instrStFld->m_dst);
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar13);
  if (!bVar8) {
    return false;
  }
  pPVar13 = IR::Opnd::AsPropertySymOpnd(instrStFld->m_dst);
  local_50 = instrStFld;
  if ((pPVar13->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar8 = ObjTypeSpecFldInfo::IsLoadedFromProto(pPVar13->objTypeSpecFldInfo), bVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cee,
                       "(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto())"
                       ,
                       "!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto()"
                      );
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
    instrStFld = local_50;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar13);
  if ((!bVar8) && (((pPVar13->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cf0,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
    instrStFld = local_50;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar13);
  if (!bVar8) {
    return false;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(pPVar13);
  if ((!bVar8) && (bVar8 = IR::PropertySymOpnd::NeedsLocalTypeCheck(pPVar13), !bVar8)) {
    return false;
  }
  local_78 = labelHelperOut;
  bVar8 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(pPVar13);
  if (bVar8) {
    if ((instrStFld->field_0x38 & 0x10) != 0) {
      BVar10 = IR::Instr::GetBailOutKind(instrStFld);
      bVar8 = IR::IsTypeCheckBailOutKind(BVar10);
      if (bVar8) goto LAB_005caf63;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cfc,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind()))"
                      );
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
LAB_005caf63:
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar13);
  if (((bVar8) && (((pPVar13->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) &&
     (pPVar13->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d00,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar8) goto LAB_005cb617;
    *puVar12 = 0;
  }
  pLVar7 = local_38;
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(local_38->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(pLVar7->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,ObjTypeSpecPhase,sourceContextId,functionId)
  ;
  this_01 = local_50;
  if (bVar8) {
    local_48 = (RegOpnd **)Js::OpCodeUtil::GetOpCodeName(local_50->m_opcode);
    pSVar3 = (pPVar13->super_SymOpnd).m_sym;
    if (pSVar3->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_40 = (LabelInstr *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&(local_40->super_Instr)._vptr_Instr = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar8) goto LAB_005cb617;
      *(undefined4 *)&(local_40->super_Instr)._vptr_Instr = 0;
    }
    uVar1 = *(uint *)&pSVar3[1]._vptr_Sym;
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(local_38->m_func->m_workItem);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    pcVar20 = L"ObjTypeSpecFldInfo";
    if (pPVar13->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      pcVar20 = L"empty";
    }
    pcVar19 = L"true";
    if (((pPVar13->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
      pcVar19 = L"false";
    }
    Output::Print(L"Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,local_48,(ulong)uVar1,pcVar15,(ulong)pPVar13->m_inlineCacheIndex,pcVar20,pcVar19)
    ;
    Output::Flush();
  }
  local_48 = typeOpndOut;
  bVar8 = IR::PropertySymOpnd::HasFinalType(pPVar13);
  if ((bVar8) &&
     ((pPVar13->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0 ||
      (bVar8 = ObjTypeSpecFldInfo::IsLoadedFromProto(pPVar13->objTypeSpecFldInfo), !bVar8)))) {
    IR::PropertySymOpnd::UpdateSlotForFinalType(pPVar13);
  }
  func = this_01->m_func;
  if ((this_01->field_0x38 & 0x10) == 0) {
    uVar21 = 0;
  }
  else {
    BVar10 = IR::Instr::GetBailOutKind(this_01);
    bVar8 = IR::IsTypeCheckBailOutKind(BVar10);
    uVar21 = (undefined4)CONCAT71(extraout_var,bVar8);
  }
  if (((pPVar13->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
    GenerateDirectFieldStore(local_38,this_01,pPVar13);
    if (((this_01->field_0x38 & 0x10) != 0) &&
       (bVar8 = IR::Instr::OnlyHasLazyBailOut(this_01), !bVar8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d4a,
                         "(!instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut())",
                         "Why does a direct field store have bailout that is not lazy?");
      if (!bVar8) goto LAB_005cb617;
      *puVar12 = 0;
    }
    bVar8 = IR::PropertySymOpnd::HasInitialType(pPVar13);
    if ((bVar8) && (bVar8 = IR::PropertySymOpnd::HasFinalType(pPVar13), bVar8)) {
      local_80.t = (Type)IR::PropertySymOpnd::GetInitialType(pPVar13);
      this_03 = JITTypeHolderBase<void>::operator->(&local_80);
      this_04 = JITType::GetTypeHandler(this_03);
      bVar8 = JITTypeHandler::IsPrototype(this_04);
      pLVar7 = local_38;
      if (bVar8) {
        LoadScriptContext(local_38,this_01);
        PVar11 = IR::PropertySymOpnd::GetPropertyId(pPVar13);
        opndArg = IR::IntConstOpnd::New((long)PVar11,TyInt32,pLVar7->m_func,true);
        LowererMD::LoadHelperArgument(&pLVar7->m_lowererMD,this_01,&opndArg->super_Opnd);
        instr = IR::Instr::New(Call,pLVar7->m_func);
        IR::Instr::InsertBefore(this_01,instr);
        LowererMD::ChangeToHelperCall
                  (&pLVar7->m_lowererMD,instr,HelperInvalidateProtoCaches,(LabelInstr *)0x0,
                   (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      }
    }
    IR::Instr::Remove(this_01);
    return true;
  }
  bVar8 = IR::PropertySymOpnd::HasFinalType(pPVar13);
  if (bVar8) {
    bVar8 = IR::PropertySymOpnd::HasInitialType(pPVar13);
    bVar18 = *(byte *)((long)&pPVar13->field_12 + 1);
    if ((bVar18 & 4) == 0 && bVar8) {
      GenerateStFldWithCachedFinalType(local_38,this_01,pPVar13);
      return true;
    }
  }
  else {
    bVar18 = (pPVar13->field_12).field_0.field_5.typeCheckSeqFlags;
  }
  if ((bVar18 & 0x20) == 0) {
    bVar8 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(pPVar13);
    local_54 = uVar21;
    if ((!bVar8) && (bVar8 = IR::PropertySymOpnd::NeedsLocalTypeCheck(pPVar13), !bVar8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d35,
                         "(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck())"
                         ,
                         "propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck()"
                        );
      if (!bVar8) goto LAB_005cb617;
      *puVar12 = 0;
      uVar21 = local_54;
    }
    local_60 = (Func *)IR::LabelInstr::New(Label,func,true);
    local_70 = IR::LabelInstr::New(Label,func,true);
    local_40 = local_70;
    if ((char)uVar21 == '\0') {
      local_70 = IR::LabelInstr::New(Label,func,true);
    }
    pLVar7 = local_38;
    local_68.t = (Type)GenerateCachedTypeCheck
                                 (local_38,this_01,pPVar13,local_70,local_40,(LabelInstr *)local_60)
    ;
    *local_48 = (RegOpnd *)local_68.t;
    GenerateDirectFieldStore(pLVar7,this_01,pPVar13);
    branchTarget = IR::LabelInstr::New(Label,func,false);
    local_48 = (RegOpnd **)CONCAT44(local_48._4_4_,0x426);
    pBVar16 = IR::BranchInstr::New(JMP,branchTarget,func);
    IR::Instr::InsertBefore(this_01,&pBVar16->super_Instr);
    IR::Instr::InsertBefore(this_01,(Instr *)local_60);
    if (((pPVar13->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
        (bVar8 = ObjTypeSpecFldInfo::IsMono(pPVar13->objTypeSpecFldInfo), bVar8)) &&
       (bVar8 = IR::PropertySymOpnd::HasInitialType(pPVar13), pLVar7 = local_38, bVar8)) {
      local_60 = func;
      GenerateCachedTypeWithoutPropertyCheck(local_38,this_01,pPVar13,(Opnd *)local_68.t,local_40);
      local_68 = IR::PropertySymOpnd::GetInitialType(pPVar13);
      finalType = IR::PropertySymOpnd::GetType(pPVar13);
      GenerateFieldStoreWithTypeChange(pLVar7,this_01,pPVar13,local_68,finalType);
      pBVar16 = IR::BranchInstr::New((OpCode)local_48,branchTarget,local_60);
      IR::Instr::InsertBefore(this_01,&pBVar16->super_Instr);
    }
    pLVar6 = local_40;
    IR::Instr::InsertBefore(this_01,&local_40->super_Instr);
    IR::Instr::InsertAfter(this_01,&branchTarget->super_Instr);
    ppLVar5 = local_78;
    if ((char)local_54 != '\0') {
      pBVar17 = IR::Instr::GetBailOutInfo(this_01);
      if (pBVar17->bailOutInstr == this_01) {
        pBVar17 = IR::Instr::GetBailOutInfo(this_01);
        if (pBVar17->polymorphicCacheIndex != pPVar13->m_inlineCacheIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1d80,
                             "(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex)"
                             ,
                             "instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex"
                            );
          if (!bVar8) goto LAB_005cb617;
          *puVar12 = 0;
        }
      }
      else {
        IVar2 = pPVar13->m_inlineCacheIndex;
        pBVar17 = IR::Instr::GetBailOutInfo(this_01);
        pBVar17->polymorphicCacheIndex = IVar2;
      }
      this_01->m_opcode = BailOut;
      IR::Instr::FreeSrc1(this_01);
      IR::Instr::FreeDst(this_01);
      GenerateBailOut(local_38,this_01,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      return true;
    }
    *continueAsHelperOut = true;
    if (local_70 == (LabelInstr *)0x0 || local_70 == pLVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d8d,
                         "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed)"
                         ,
                         "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed"
                        );
      if (!bVar8) {
LAB_005cb617:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
    *ppLVar5 = local_70;
  }
  return false;
}

Assistant:

bool
Lowerer::GenerateStFldWithCachedType(IR::Instr *instrStFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::RegOpnd *typeOpnd = nullptr;
    IR::LabelInstr* labelObjCheckFailed  = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelBothTypeChecksFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrStFld->GetDst()->IsSymOpnd());
    if (!instrStFld->GetDst()->AsSymOpnd()->IsPropertySymOpnd() || !instrStFld->GetDst()->AsPropertySymOpnd()->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrStFld->GetDst()->AsPropertySymOpnd();

    // If we have any object type spec info, we better not believe this is a load from prototype, since this is a store
    // and we never share inline caches between loads and stores.
    Assert(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto());

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    Func* func = instrStFld->m_func;

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind());

    // If the type hasn't been checked upstream, see if it makes sense to check it here.
    bool isTypeChecked = propertySymOpnd->IsTypeChecked();
    if (!isTypeChecked)
    {
        // If the initial type has been checked, we can do a hard coded type transition without any type checks
        // (see GenerateStFldWithCachedFinalType), which is always worth doing, even if the type is not needed
        // downstream.  We're not introducing any additional bailouts.
        if (propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType() && !propertySymOpnd->IsTypeDead())
        {
            // We have a final type in hand, so we can JIT (most of) the type transition work.
            return this->GenerateStFldWithCachedFinalType(instrStFld, propertySymOpnd);
        }

        if (propertySymOpnd->HasTypeMismatch())
        {
            // So we have a type mismatch, which happens when the type (and the type without property if ObjTypeSpecStore
            // is on) on this instruction didn't match the live type value according to the flow. We must have hit some
            // stale inline cache (perhaps inlined from a different function, or on a code path not taken for a while).
            // Either way, we know exactly what type the object must have at this point (fully determined by flow), but
            // we don't know whether that type already has the property we're storing here. All in all, we know exactly
            // what shape the object will have after this operation, but we're not sure what label (type) to give this
            // shape. Thus we can simply let the fast path do its thing based on the live inline cache. The downstream
            // instructions relying only on this shape (loads and stores) are safe, and those that need the next type
            // (i.e. adds) will do the same thing as this instruction.
            return false;
        }

        // If we're still here then we must need a primary type check on this instruction to protect
        // a sequence of field operations downstream, or a local type check for an isolated field store.
        Assert(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck());

        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelBothTypeChecksFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelBothTypeChecksFailed : IR::LabelInstr::New(Js::OpCode::Label, func, true);
        typeOpnd = this->GenerateCachedTypeCheck(instrStFld, propertySymOpnd, labelObjCheckFailed, labelBothTypeChecksFailed, labelTypeCheckFailed);
        *typeOpndOut = typeOpnd;
    }

    // Either we are protected by a type check upstream or we just emitted a type check above,
    // now it's time to store the field value.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    // If we are protected by a type check upstream, we don't need a bailout or helper here, delete the instruction
    // and return "true" to indicate that we succeeded in eliminating it.
    if (isTypeChecked)
    {
        Assert(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr);
        AssertMsg(
            !instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut(),
            "Why does a direct field store have bailout that is not lazy?"
        );

        if (propertySymOpnd->HasInitialType() && propertySymOpnd->HasFinalType())
        {
            bool isPrototypeTypeHandler = propertySymOpnd->GetInitialType()->GetTypeHandler()->IsPrototype();
            if (isPrototypeTypeHandler)
            {
                LoadScriptContext(instrStFld);
                m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
                IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
                instrStFld->InsertBefore(invalidateCallInstr);
                m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
            }
        }
        instrStFld->Remove();
        return true;
    }

    // Otherwise, branch around the helper on successful type check.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
    instrStFld->InsertBefore(instr);

    // On failed type check, try the type without property if we've got one.
    instrStFld->InsertBefore(labelTypeCheckFailed);

    // Caution, this is one of the dusty corners of the JIT.  We only get here if this is an isolated StFld which adds a property, or
    // ObjTypeSpecStore is off.  In the former case no downstream operations depend on the final type produced here, and we can fall
    // back on live cache and helper if the type doesn't match.  In the latter we may have a cache with type transition, which must
    // produce a value for the type after transition, because that type is consumed downstream. Thus, if the object's type doesn't
    // match either the type with or the type without the property we're storing, we must bail out here.
    bool emitAddProperty = propertySymOpnd->IsMono() && propertySymOpnd->HasInitialType();

    if (emitAddProperty)
    {
        GenerateCachedTypeWithoutPropertyCheck(instrStFld, propertySymOpnd, typeOpnd, labelBothTypeChecksFailed);
        GenerateFieldStoreWithTypeChange(instrStFld, propertySymOpnd, propertySymOpnd->GetInitialType(), propertySymOpnd->GetType());
        instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
        instrStFld->InsertBefore(instr);
    }

    instrStFld->InsertBefore(labelBothTypeChecksFailed);
    instrStFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        if (instrStFld->GetBailOutInfo()->bailOutInstr != instrStFld)
        {
            // Set the cache index in the bailout info so that the generated code will write it into the
            // bailout record at runtime.
            instrStFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex);
        }

        instrStFld->m_opcode = Js::OpCode::BailOut;
        instrStFld->FreeSrc1();
        instrStFld->FreeDst();

        this->GenerateBailOut(instrStFld);
        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}